

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_annotation.c
# Opt level: O0

HPDF_STATUS HPDF_TextAnnot_SetIcon(HPDF_Annotation annot,HPDF_AnnotIcon icon)

{
  HPDF_BOOL HVar1;
  HPDF_STATUS HVar2;
  HPDF_AnnotIcon icon_local;
  HPDF_Annotation annot_local;
  
  HVar1 = CheckSubType(annot,HPDF_ANNOT_TEXT_NOTES);
  if (HVar1 == 0) {
    annot_local = (HPDF_Annotation)0x101c;
  }
  else if (icon < HPDF_ANNOT_ICON_EOF) {
    HVar2 = HPDF_Dict_AddName(annot,"Name",HPDF_ANNOT_ICON_NAMES_NAMES[(int)icon]);
    if (HVar2 == 0) {
      annot_local = (HPDF_Annotation)0x0;
    }
    else {
      annot_local = (HPDF_Annotation)HPDF_CheckError(annot->error);
    }
  }
  else {
    annot_local = (HPDF_Annotation)HPDF_RaiseError(annot->error,0x1072,(ulong)icon);
  }
  return (HPDF_STATUS)annot_local;
}

Assistant:

HPDF_EXPORT(HPDF_STATUS)
HPDF_TextAnnot_SetIcon  (HPDF_Annotation  annot,
                         HPDF_AnnotIcon   icon)
{
    HPDF_PTRACE((" HPDF_TextAnnot_SetIcon\n"));

    if (!CheckSubType (annot, HPDF_ANNOT_TEXT_NOTES))
        return HPDF_INVALID_ANNOTATION;

    if (icon >= HPDF_ANNOT_ICON_EOF)
        return HPDF_RaiseError (annot->error, HPDF_ANNOT_INVALID_ICON,
                (HPDF_STATUS)icon);

    if (HPDF_Dict_AddName (annot, "Name",
        HPDF_ANNOT_ICON_NAMES_NAMES[(HPDF_INT)icon]) != HPDF_OK)
        return HPDF_CheckError (annot->error);

    return HPDF_OK;
}